

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

GLenum __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreIncompleteTexturesTest::Create2DRGBA8CompleteTexture
          (ImageLoadStoreIncompleteTexturesTest *this,GLubyte magic_number,GLuint *out_texture_id)

{
  GLuint GVar1;
  reference pvVar2;
  uint local_68;
  GLuint texel_offset;
  GLuint x;
  GLuint line_offset;
  GLuint y;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  GLuint texture_id;
  GLenum err;
  GLuint texture_data_size;
  GLuint *out_texture_id_local;
  GLubyte magic_number_local;
  ImageLoadStoreIncompleteTexturesTest *this_local;
  
  GVar1 = this->m_texture_edge;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
             (ulong)(GVar1 * GVar1 * 4));
  for (x = 0; x < this->m_texture_edge; x = x + 1) {
    GVar1 = this->m_texture_edge;
    for (local_68 = 0; local_68 < this->m_texture_edge; local_68 = local_68 + 1) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                          (ulong)(local_68 * 4 + x * GVar1 * 4));
      SetTexel(this,pvVar2,(GLubyte)local_68,(GLubyte)x,magic_number);
    }
  }
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,
             (GLuint *)
             ((long)&texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  this_local._4_4_ =
       glu::CallLogWrapper::glGetError
                 (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   super_CallLogWrapper);
  if (this_local._4_4_ == 0) {
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,
               texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    this_local._4_4_ =
         glu::CallLogWrapper::glGetError
                   (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                     super_CallLogWrapper);
    if (this_local._4_4_ == 0) {
      GVar1 = this->m_texture_edge;
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
      glu::CallLogWrapper::glTexImage2D
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0,0x8058,GVar1,GVar1,0,0x1908,0x1401,pvVar2);
      this_local._4_4_ =
           glu::CallLogWrapper::glGetError
                     (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper);
      if (this_local._4_4_ == 0) {
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0x813c,0);
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0x813d,0);
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0x2801,0x2601);
        this_local._4_4_ =
             glu::CallLogWrapper::glGetError
                       (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper);
        if (this_local._4_4_ == 0) {
          *out_texture_id =
               texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          this_local._4_4_ = 0;
        }
        else {
          glu::CallLogWrapper::glDeleteTextures
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,
                     (GLuint *)
                     ((long)&texture_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        }
      }
      else {
        glu::CallLogWrapper::glDeleteTextures
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,
                   (GLuint *)
                   ((long)&texture_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 4));
      }
    }
    else {
      glu::CallLogWrapper::glDeleteTextures
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,
                 (GLuint *)
                 ((long)&texture_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return this_local._4_4_;
}

Assistant:

GLenum Create2DRGBA8CompleteTexture(GLubyte magic_number, GLuint& out_texture_id)
	{
		/* Constants to calculate size of texture */
		static const GLuint n_components	  = 4; /* RGBA */
		const GLuint		texture_data_size = m_texture_edge * m_texture_edge * n_components;

		/* Error code */
		GLenum err = 0;

		/* Texture id */
		GLuint texture_id = 0;

		/* Prepare storage for texture data */
		std::vector<GLubyte> texture_data;
		texture_data.resize(texture_data_size);

		/* Prepare texture data */
		for (GLuint y = 0; y < m_texture_edge; ++y)
		{
			const GLuint line_offset = y * m_texture_edge * n_components;

			for (GLuint x = 0; x < m_texture_edge; ++x)
			{
				const GLuint texel_offset = x * n_components + line_offset;

				SetTexel(&texture_data[texel_offset], static_cast<GLubyte>(x), static_cast<GLubyte>(y), magic_number);
			}
		}

		/* Generate texture */
		glGenTextures(1, &texture_id);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			return err;
		}

		/* Bind texture */
		glBindTexture(GL_TEXTURE_2D, texture_id);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Allocate storage and fill texture */
		glTexImage2D(GL_TEXTURE_2D, 0 /* level */, GL_RGBA8, m_texture_edge, m_texture_edge, 0 /* border */, GL_RGBA,
					 GL_UNSIGNED_BYTE, &texture_data[0]);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Make texture complete */
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Set out_texture_id */
		out_texture_id = texture_id;

		/* Done */
		return GL_NO_ERROR;
	}